

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::RealMath2Function<&atan2>::RealMath2Function
          (RealMath2Function<&atan2> *this,Compilation *comp,string *name)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_49;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_48;
  Type *local_30;
  Type *local_28;
  
  local_30 = comp->realType;
  __l._M_len = 2;
  __l._M_array = &local_30;
  local_28 = local_30;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_48,__l,&local_49);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,2,&local_48,comp->realType,false,
             false);
  if (local_48.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_0050e410;
  return;
}

Assistant:

RealMath2Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 2,
                               {&comp.getRealType(), &comp.getRealType()}, comp.getRealType(),
                               false) {}